

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::compileConst(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader source;
  Reader source_00;
  Builder target;
  Reader type;
  ImplicitParams implicitMethodParams;
  undefined1 auVar1 [40];
  Builder target_00;
  bool bVar2;
  Builder typeBuilder;
  undefined1 uStack_129;
  undefined4 uStack_124;
  Maybe<capnp::Schema> local_118;
  StructBuilder local_108;
  Builder local_e0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  Reader local_88;
  Reader local_58;
  
  capnp::schema::Node::Const::Builder::initType((Builder *)&local_108,&builder);
  Declaration::Const::Reader::getType(&local_58,&decl);
  implicitMethodParams.params.reader._44_4_ = uStack_124;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_129;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  source._reader.capTable = local_58._reader.capTable;
  source._reader.segment = local_58._reader.segment;
  source._reader.data = local_58._reader.data;
  source._reader.pointers = local_58._reader.pointers;
  source._reader.dataSize = local_58._reader.dataSize;
  source._reader.pointerCount = local_58._reader.pointerCount;
  source._reader._38_2_ = local_58._reader._38_2_;
  source._reader.nestingLimit = local_58._reader.nestingLimit;
  source._reader._44_4_ = local_58._reader._44_4_;
  target._builder.capTable = local_108.capTable;
  target._builder.segment = local_108.segment;
  target._builder.data = local_108.data;
  target._builder.pointers = local_108.pointers;
  target._builder.dataSize = local_108.dataSize;
  target._builder.pointerCount = local_108.pointerCount;
  target._builder._38_2_ = local_108._38_2_;
  auVar1 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar1._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar1._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar1._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar1._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar1._32_4_;
  implicitMethodParams.params.reader.step = auVar1._36_4_;
  bVar2 = compileType(this,source,target,implicitMethodParams);
  if (bVar2) {
    Declaration::Const::Reader::getValue(&local_88,&decl);
    capnp::_::StructBuilder::asReader(&local_108);
    capnp::schema::Node::Const::Builder::initValue(&local_e0,&builder);
    local_118.ptr.isSet = false;
    source_00._reader.capTable = local_88._reader.capTable;
    source_00._reader.segment = local_88._reader.segment;
    source_00._reader.data = local_88._reader.data;
    source_00._reader.pointers = local_88._reader.pointers;
    source_00._reader.dataSize = local_88._reader.dataSize;
    source_00._reader.pointerCount = local_88._reader.pointerCount;
    source_00._reader._38_2_ = local_88._reader._38_2_;
    source_00._reader.nestingLimit = local_88._reader.nestingLimit;
    source_00._reader._44_4_ = local_88._reader._44_4_;
    type._reader.capTable = (CapTableReader *)uStack_b0;
    type._reader.segment = (SegmentReader *)local_b8;
    type._reader.data = (void *)local_a8;
    type._reader.pointers = (WirePointer *)uStack_a0;
    type._reader.dataSize = (undefined4)local_98;
    type._reader.pointerCount = local_98._4_2_;
    type._reader._38_2_ = local_98._6_2_;
    type._reader._40_8_ = uStack_90;
    target_00._builder.capTable = local_e0._builder.capTable;
    target_00._builder.segment = local_e0._builder.segment;
    target_00._builder.data = local_e0._builder.data;
    target_00._builder.pointers = local_e0._builder.pointers;
    target_00._builder.dataSize = local_e0._builder.dataSize;
    target_00._builder.pointerCount = local_e0._builder.pointerCount;
    target_00._builder._38_2_ = local_e0._builder._38_2_;
    compileBootstrapValue(this,source_00,type,target_00,&local_118);
  }
  return;
}

Assistant:

void NodeTranslator::compileConst(Declaration::Const::Reader decl,
                                  schema::Node::Const::Builder builder) {
  auto typeBuilder = builder.initType();
  if (compileType(decl.getType(), typeBuilder, ImplicitParams::none())) {
    compileBootstrapValue(decl.getValue(), typeBuilder.asReader(), builder.initValue());
  }
}